

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O1

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
applyHouseholderOnTheRight<Eigen::Matrix<double,1,1,0,1,1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *this,
          Matrix<double,_1,_1,_0,_1,_1> *essential,Scalar *tau,Scalar *workspace)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  char *pcVar8;
  undefined8 *puVar9;
  SrcEvaluatorType *pSVar10;
  SrcEvaluatorType *pSVar11;
  mul_assign_op<double,_double> **ppmVar12;
  SrcEvaluatorType *pSVar13;
  long lVar14;
  ActualDstType actualDst;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> tmp;
  DstEvaluatorType dstEvaluator_1;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_181;
  undefined1 local_180 [24];
  DstEvaluatorType local_168;
  undefined1 local_150 [16];
  variable_if_dynamic<long,__1> local_140;
  PointerType local_138;
  variable_if_dynamic<long,__1> vStack_130;
  variable_if_dynamic<long,__1> local_128;
  XprTypeNested pMStack_120;
  variable_if_dynamic<long,__1> local_118;
  variable_if_dynamic<long,__1> vStack_110;
  Index local_108;
  variable_if_dynamic<long,__1> local_100;
  variable_if_dynamic<long,__1> local_f8;
  Index local_f0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>
  local_e8;
  undefined1 local_c8 [16];
  mul_assign_op<double,_double> *local_b8;
  scalar_constant_op<double> local_b0;
  Scalar *local_a8;
  SrcEvaluatorType *local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  type local_88;
  scalar_constant_op<double> local_78;
  Scalar *local_68;
  Matrix<double,_1,_1,_0,_1,_1> *local_60;
  variable_if_dynamic<long,__1> local_58;
  RhsEtorType local_50;
  Index local_48;
  Matrix<double,_1,_1,_0,_1,_1> *local_40;
  undefined8 local_38;
  
  if (*(long *)(this + 0x10) == 1) {
    if (-1 < *(long *)(this + 8)) {
      local_e8.m_dst = (DstEvaluatorType *)(1.0 - *tau);
      local_c8._8_8_ = &local_e8;
      local_150._0_8_ = *(undefined8 *)this;
      local_c8._0_8_ = local_150;
      local_140.m_value = *(long *)(*(long *)(this + 0x18) + 8);
      local_b8 = (mul_assign_op<double,_double> *)&local_168;
      local_b0.m_other = (double)this;
      internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
             *)local_c8);
      return;
    }
    pcVar8 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
    goto LAB_00148be7;
  }
  if ((*tau == 0.0) && (!NAN(*tau))) {
    return;
  }
  local_180._8_8_ = *(undefined8 *)(this + 8);
  local_180._0_8_ = workspace;
  if ((long)local_180._8_8_ < 0) {
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                  ,0xa6,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  local_150._0_8_ = *(long *)this + *(long *)(*(long *)(this + 0x18) + 8) * 8;
  local_150._8_8_ = local_180._8_8_;
  if (*(long *)(this + 0x10) != 2) {
    __assert_fail("v == T(Value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/XprHelper.h"
                  ,0x85,
                  "Eigen::internal::variable_if_dynamic<long, 1>::variable_if_dynamic(T) [T = long, Value = 1]"
                 );
  }
  if ((long)(local_180._8_8_ | 1) < 0 && *(long *)this != 0) {
    pcVar8 = 
    "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, Level = 0]"
    ;
    goto LAB_00148c44;
  }
  local_128.m_value = *(long *)(this + 0x10);
  pMStack_120 = *(XprTypeNested *)(this + 0x18);
  local_108 = *(Index *)(this + 0x30);
  local_118.m_value = *(long *)(this + 0x20);
  vStack_110.m_value = *(long *)(this + 0x28);
  local_138 = *(PointerType *)this;
  vStack_130.m_value = *(long *)(this + 8);
  local_100.m_value = 0;
  local_f8.m_value = 1;
  local_f0 = ((*(XprTypeNested *)(this + 0x18))->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  puVar9 = (undefined8 *)(local_150 + 0x10);
  ppmVar12 = &local_b8;
  for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
    *ppmVar12 = (mul_assign_op<double,_double> *)*puVar9;
    puVar9 = puVar9 + 1;
    ppmVar12 = ppmVar12 + 1;
  }
  local_48 = *(Index *)(CONCAT71(uStack_97,local_98) + 8);
  local_38 = 1;
  local_e8.m_dstExpr = (DstXprType *)local_180;
  local_168.
  super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  .m_data = workspace;
  local_168.
  super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value = local_180._8_8_;
  local_e8.m_dst = &local_168;
  local_e8.m_src = (SrcEvaluatorType *)local_c8;
  local_e8.m_functor = (sub_assign_op<double,_double> *)&local_181;
  local_c8._0_8_ = local_150._0_8_;
  local_c8._8_8_ = local_180._8_8_;
  local_60 = essential;
  local_58.m_value = local_150._0_8_;
  local_40 = essential;
  internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)&local_e8);
  lVar7 = *(long *)this;
  if ((long)*(SrcEvaluatorType **)(this + 8) < 0 && lVar7 != 0) {
LAB_00148b82:
    pcVar8 = 
    "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Level = 0]"
    ;
LAB_00148c44:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,pcVar8);
  }
  if (*(long *)(this + 0x10) < 1) {
LAB_00148b9c:
    __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                  ,0x7a,
                  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                 );
  }
  if ((SrcEvaluatorType *)local_180._8_8_ != *(SrcEvaluatorType **)(this + 8)) {
    pcVar8 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Functor = Eigen::internal::add_assign_op<double, double>]"
    ;
LAB_00148c99:
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2f2,pcVar8);
  }
  pSVar13 = (SrcEvaluatorType *)local_180._8_8_;
  if (((local_180._0_8_ & 7) == 0) &&
     (pSVar13 = (SrcEvaluatorType *)(ulong)((uint)((ulong)local_180._0_8_ >> 3) & 1),
     (long)local_180._8_8_ <= (long)pSVar13)) {
    pSVar13 = (SrcEvaluatorType *)local_180._8_8_;
  }
  lVar14 = local_180._8_8_ - (long)pSVar13;
  if (0 < (long)pSVar13) {
    pSVar10 = (SrcEvaluatorType *)0x0;
    do {
      *(double *)(local_180._0_8_ + pSVar10 * 8) =
           *(double *)(lVar7 + (long)pSVar10 * 8) + *(double *)(local_180._0_8_ + pSVar10 * 8);
      pSVar10 = (SrcEvaluatorType *)((long)&(pSVar10->m_functor).m_other + 1);
    } while (pSVar13 != pSVar10);
  }
  pSVar10 = (SrcEvaluatorType *)
            ((long)&(pSVar13->m_functor).m_other + (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU)
            );
  if (1 < lVar14) {
    do {
      pdVar1 = (double *)(lVar7 + (long)pSVar13 * 8);
      dVar5 = pdVar1[1];
      dVar3 = ((double *)(local_180._0_8_ + pSVar13 * 8))[1];
      *(Scalar *)(local_180._0_8_ + pSVar13 * 8) =
           *pdVar1 + *(double *)(local_180._0_8_ + pSVar13 * 8);
      ((Scalar *)(local_180._0_8_ + pSVar13 * 8))[1] = dVar5 + dVar3;
      pSVar13 = (SrcEvaluatorType *)((long)&(pSVar13->m_functor).m_other + 2);
    } while ((long)pSVar13 < (long)pSVar10);
  }
  if ((long)pSVar10 < (long)local_180._8_8_) {
    do {
      *(double *)(local_180._0_8_ + pSVar10 * 8) =
           *(double *)(lVar7 + (long)pSVar10 * 8) + *(double *)(local_180._0_8_ + pSVar10 * 8);
      pSVar10 = (SrcEvaluatorType *)((long)&(pSVar10->m_functor).m_other + 1);
    } while ((SrcEvaluatorType *)local_180._8_8_ != pSVar10);
  }
  if (-1 < (long)local_180._8_8_) {
    uVar4 = *(ulong *)this;
    pSVar13 = *(SrcEvaluatorType **)(this + 8);
    if ((long)pSVar13 < 0 && uVar4 != 0) goto LAB_00148b82;
    if (*(long *)(this + 0x10) < 1) goto LAB_00148b9c;
    if (pSVar13 != (SrcEvaluatorType *)local_180._8_8_) {
      pcVar8 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>, Functor = Eigen::internal::sub_assign_op<double, double>]"
      ;
      goto LAB_00148c99;
    }
    pSVar10 = pSVar13;
    if (((uVar4 & 7) == 0) &&
       (pSVar10 = (SrcEvaluatorType *)(ulong)((uint)(uVar4 >> 3) & 1),
       (long)pSVar13 <= (long)pSVar10)) {
      pSVar10 = pSVar13;
    }
    dVar3 = *tau;
    lVar7 = (long)pSVar13 - (long)pSVar10;
    if (0 < (long)pSVar10) {
      pSVar11 = (SrcEvaluatorType *)0x0;
      do {
        *(double *)(uVar4 + (long)pSVar11 * 8) =
             *(double *)(uVar4 + (long)pSVar11 * 8) -
             *(double *)(local_180._0_8_ + pSVar11 * 8) * dVar3;
        pSVar11 = (SrcEvaluatorType *)((long)&(pSVar11->m_functor).m_other + 1);
      } while (pSVar10 != pSVar11);
    }
    pSVar11 = (SrcEvaluatorType *)
              ((long)&(pSVar10->m_functor).m_other + (lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffeU)
              );
    if (1 < lVar7) {
      do {
        dVar5 = ((double *)(local_180._0_8_ + pSVar10 * 8))[1];
        pdVar1 = (double *)(uVar4 + (long)pSVar10 * 8);
        dVar6 = pdVar1[1];
        pdVar2 = (double *)(uVar4 + (long)pSVar10 * 8);
        *pdVar2 = *pdVar1 - *(double *)(local_180._0_8_ + pSVar10 * 8) * dVar3;
        pdVar2[1] = dVar6 - dVar5 * dVar3;
        pSVar10 = (SrcEvaluatorType *)((long)&(pSVar10->m_functor).m_other + 2);
      } while ((long)pSVar10 < (long)pSVar11);
    }
    if ((long)pSVar11 < (long)pSVar13) {
      do {
        *(double *)(uVar4 + (long)pSVar11 * 8) =
             *(double *)(uVar4 + (long)pSVar11 * 8) -
             *(double *)(local_180._0_8_ + pSVar11 * 8) * dVar3;
        pSVar11 = (SrcEvaluatorType *)((long)&(pSVar11->m_functor).m_other + 1);
      } while (pSVar13 != pSVar11);
    }
    if (-1 < (long)local_180._8_8_) {
      if (local_150._8_8_ == local_180._8_8_) {
        local_b0.m_other = *tau;
        local_c8._8_8_ = local_180._8_8_;
        local_a8 = (Scalar *)local_180._0_8_;
        local_a0 = (SrcEvaluatorType *)local_180._8_8_;
        local_98 = local_180[0x10];
        local_68 = (Scalar *)local_180._0_8_;
        local_58.m_value = local_180._8_8_;
        local_48 = 1;
        local_e8.m_dstExpr = (DstXprType *)local_150;
        local_168.
        super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_data = (PointerType)local_150._0_8_;
        local_168.
        super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value =
             (pMStack_120->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_rows;
        local_e8.m_dst = &local_168;
        local_e8.m_src = (SrcEvaluatorType *)local_c8;
        local_e8.m_functor = (sub_assign_op<double,_double> *)&local_181;
        local_88.m_matrix = essential;
        local_78.m_other = local_b0.m_other;
        local_50.
        super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::IndexBased,_double>
        .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>.m_d.data =
             (unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::IndexBased,_double>
              )(unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::IndexBased,_double>
                )essential;
        internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>,_3,_0>
        ::run(&local_e8);
        return;
      }
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/ProductEvaluators.h"
                    ,0xb0,
                    "static void Eigen::internal::Assignment<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>, Eigen::Transpose<const Eigen::Matrix<double, 1, 1>>>, Eigen::internal::sub_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::sub_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, SrcXprType = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>, Eigen::Transpose<const Eigen::Matrix<double, 1, 1>>>, Functor = Eigen::internal::sub_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                   );
    }
  }
  pcVar8 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
  ;
LAB_00148be7:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,pcVar8);
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else if(tau!=Scalar(0))
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential;
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.adjoint();
  }
}